

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcBooleanClippingResult::~IfcBooleanClippingResult
          (IfcBooleanClippingResult *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  *(undefined8 *)&this[-1].super_IfcBooleanResult.super_IfcGeometricRepresentationItem.field_0x28 =
       0x7f4c28;
  *(undefined8 *)
   &(this->super_IfcBooleanResult).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7f4ca0;
  *(undefined8 *)&this[-1].super_IfcBooleanResult.field_0x38 = 0x7f4c50;
  *(undefined8 *)&this[-1].super_IfcBooleanResult.field_0x48 = 0x7f4c78;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0x90 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this[-1].field_0x90);
  }
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            &this[-1].super_IfcBooleanResult.field_0x80;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = this[-1].super_IfcBooleanResult.FirstOperand.
           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  p_Var2 = &this[-1].super_IfcBooleanResult.SecondOperand.
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2) {
    operator_delete(p_Var1,(ulong)((long)&p_Var2->_M_pi->_vptr__Sp_counted_base + 1));
  }
  operator_delete(&this[-1].super_IfcBooleanResult.super_IfcGeometricRepresentationItem.field_0x28,
                  0x98);
  return;
}

Assistant:

IfcBooleanClippingResult() : Object("IfcBooleanClippingResult") {}